

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

long kj::TlsConnection::bioCtrl(BIO *b,int cmd,long num,void *ptr)

{
  long lVar1;
  int local_4;
  
  if (cmd < 0xb) {
    if (cmd - 6U < 2) {
      return 0;
    }
    if (cmd == 2) {
      lVar1 = BIO_get_data();
      return (ulong)*(byte *)(lVar1 + 0x59);
    }
  }
  else {
    if (cmd == 0xb) {
      return 1;
    }
    if (cmd == 0x49) {
      return 0;
    }
    if (cmd == 0x4c) {
      return 0;
    }
  }
  if (kj::_::Debug::minSeverity < 2) {
    kj::_::Debug::log<char_const(&)[23],int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
               ,0x1d4,WARNING,"\"unimplemented bio_ctrl\", cmd",
               (char (*) [23])"unimplemented bio_ctrl",&local_4);
  }
  return 0;
}

Assistant:

static long bioCtrl(BIO* b, int cmd, long num, void* ptr) {
    switch (cmd) {
      case BIO_CTRL_EOF:
        return reinterpret_cast<TlsConnection*>(BIO_get_data(b))->readBuffer.isAtEnd();
      case BIO_CTRL_FLUSH:
        return 1;
      case BIO_CTRL_PUSH:
      case BIO_CTRL_POP:
        // Informational?
        return 0;
#ifdef BIO_CTRL_GET_KTLS_SEND
      case BIO_CTRL_GET_KTLS_SEND:
      case BIO_CTRL_GET_KTLS_RECV:
        // TODO(someday): Support kTLS if the underlying stream is a raw socket.
        return 0;
#endif
      default:
        KJ_LOG(WARNING, "unimplemented bio_ctrl", cmd);
        return 0;
    }
  }